

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleAppPropertyEditor(bool *p_open)

{
  bool bVar1;
  int local_2c;
  int obj_i;
  ImVec2 local_20;
  ImVec2 local_18;
  bool *local_10;
  bool *p_open_local;
  
  local_10 = p_open;
  ImVec2::ImVec2(&local_18,430.0,450.0);
  ImGui::SetNextWindowSize(&local_18,4);
  bVar1 = ImGui::Begin("Example: Property editor",local_10,0);
  if (bVar1) {
    HelpMarker(
              "This example shows how you may implement a property editor using two columns.\nAll objects/fields data are dummies here.\nRemember that in many simple cases, you can use ImGui::SameLine(xxx) to position\nyour cursor horizontally instead of using the Columns() API."
              );
    ImVec2::ImVec2(&local_20,2.0,2.0);
    ImGui::PushStyleVar(0xb,&local_20);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd8,0.0,0.0);
    bVar1 = ImGui::BeginTable("split",2,0x501,(ImVec2 *)&stack0xffffffffffffffd8,0.0);
    if (bVar1) {
      for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
        ShowPlaceholderObject("Object",local_2c);
      }
      ImGui::EndTable();
    }
    ImGui::PopStyleVar(1);
    ImGui::End();
  }
  else {
    ImGui::End();
  }
  return;
}

Assistant:

static void ShowExampleAppPropertyEditor(bool* p_open)
{
    ImGui::SetNextWindowSize(ImVec2(430, 450), ImGuiCond_FirstUseEver);
    if (!ImGui::Begin("Example: Property editor", p_open))
    {
        ImGui::End();
        return;
    }

    HelpMarker(
        "This example shows how you may implement a property editor using two columns.\n"
        "All objects/fields data are dummies here.\n"
        "Remember that in many simple cases, you can use ImGui::SameLine(xxx) to position\n"
        "your cursor horizontally instead of using the Columns() API.");

    ImGui::PushStyleVar(ImGuiStyleVar_FramePadding, ImVec2(2, 2));
    if (ImGui::BeginTable("split", 2, ImGuiTableFlags_BordersOuter | ImGuiTableFlags_Resizable))
    {
        // Iterate placeholder objects (all the same data)
        for (int obj_i = 0; obj_i < 4; obj_i++)
        {
            ShowPlaceholderObject("Object", obj_i);
            //ImGui::Separator();
        }
        ImGui::EndTable();
    }
    ImGui::PopStyleVar();
    ImGui::End();
}